

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

void generate_SSA(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes,map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                         *global,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom_f,vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *vars,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  reference pvVar4;
  pointer ppVar5;
  ulong uVar6;
  size_type sVar7;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RCX;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_bool>
  pVar8;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar9;
  int i_1;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_000001e8;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *in_stack_000001f0;
  BasicBlock *in_stack_000001f8;
  VarId *in_stack_00000200;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom_tree;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> varset_1;
  shared_ptr<mir::inst::PhiInst> irphi_1;
  iterator itera_1;
  iterator ss;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> varset;
  shared_ptr<mir::inst::PhiInst> irphi;
  iterator itera;
  iterator iter;
  int i;
  iterator itt;
  int b;
  iterator s;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  phi;
  iterator it;
  BasicBlock *in_stack_fffffffffffffaa8;
  pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *in_stack_fffffffffffffab0;
  VarId *this;
  const_iterator in_stack_fffffffffffffab8;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_fffffffffffffac0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *this_00;
  value_type *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  *__k;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_01;
  iterator in_stack_fffffffffffffaf8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb24;
  _Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
  in_stack_fffffffffffffb28;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_fffffffffffffb40;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_fffffffffffffb48;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffc08;
  VarId local_398;
  char local_388 [20];
  int local_374;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2e0;
  _Base_ptr local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_280;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_278;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_248;
  _Base_ptr local_228;
  _Self local_220;
  _Base_ptr local_218;
  _Rb_tree_const_iterator<mir::inst::VarId> local_210;
  _Base_ptr local_208;
  undefined1 local_200;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_180;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_160;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_158;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_128;
  int local_10c;
  _Self local_108;
  _Self local_100;
  value_type local_f4;
  _Base_ptr local_f0;
  _Self local_e8;
  _Base_ptr local_e0;
  _Rb_tree_const_iterator<int> local_d8 [13];
  _Self local_70;
  _Base_ptr local_68;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_30 [6];
  
  std::
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::_Rb_tree_iterator(local_30);
  std::
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x283a81);
  local_68 = (_Base_ptr)
             std::
             map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::begin((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)in_stack_fffffffffffffaa8);
  local_30[0]._M_node = local_68;
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)in_stack_fffffffffffffaa8);
    bVar1 = std::operator!=(local_30,&local_70);
    if (!bVar1) break;
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffab0);
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(local_d8);
    std::
    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)0x283b02);
    local_e0 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffaa8);
    local_d8[0]._M_node = local_e0;
    while( true ) {
      std::
      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)0x283b33);
      local_e8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffaa8);
      bVar1 = std::operator!=(local_d8,&local_e8);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<int>::operator*
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffab0);
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffab0,
                 &in_stack_fffffffffffffaa8->id);
      local_f0 = (_Base_ptr)
                 std::_Rb_tree_const_iterator<int>::operator++
                           ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffab8._M_current,
                            (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
    }
    while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                             ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x283bdd),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                         ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x283c05);
      local_f4 = *pvVar2;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x283c2d);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_fffffffffffffaa8,(key_type *)0x283c44);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)in_stack_fffffffffffffaa8);
      bVar1 = std::operator!=(&local_100,&local_108);
      if (bVar1) {
        local_10c = 0;
        while( true ) {
          uVar6 = (ulong)local_10c;
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                 *)0x283cb9);
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&ppVar3->second);
          if (sVar7 <= uVar6) break;
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                 *)0x283ce6);
          std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
          local_128.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                        ::find((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                *)in_stack_fffffffffffffaa8,(key_type *)0x283d0a);
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                 *)0x283d31);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&ppVar3->second,(long)local_10c);
          if (-1 < *pvVar4) {
            local_128.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)std::
                          map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                          ::end((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                 *)in_stack_fffffffffffffaa8);
            bVar1 = std::operator==((_Self *)&local_128.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (_Self *)&local_128.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
            if (bVar1) {
              ppVar3 = std::
                       _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)0x283d8e);
              std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
              local_128.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)std::
                            map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                            ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                                    *)in_stack_fffffffffffffaa8,(key_type *)0x283db2);
              std::
              _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            *)0x283dd9);
              mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffffab0,(VarId *)in_stack_fffffffffffffaa8);
              ir_phi((VarId *)in_stack_fffffffffffffb28._M_node,in_stack_fffffffffffffb24);
              in_stack_fffffffffffffb48 = &local_128;
              std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
              operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *
                         )0x283e1f);
              std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
              operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *
                         )0x283e3c);
              local_160 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)std::
                             vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                             ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                      *)in_stack_fffffffffffffaa8);
              local_158 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)__gnu_cxx::
                             __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                             ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                          *)in_stack_fffffffffffffab8._M_current,
                                         (difference_type)in_stack_fffffffffffffab0);
              __gnu_cxx::
              __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
              ::
              __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                        ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                          *)in_stack_fffffffffffffab0,
                         (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                          *)in_stack_fffffffffffffaa8);
              std::
              variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
              ::
              variant<std::shared_ptr<mir::inst::PhiInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
                        ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                          *)in_stack_fffffffffffffab0,
                         (shared_ptr<mir::inst::PhiInst> *)in_stack_fffffffffffffaa8);
              local_180 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)std::
                             vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                             ::insert((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                       *)in_stack_fffffffffffffab0,in_stack_fffffffffffffab8,
                                      (value_type *)in_stack_fffffffffffffaa8);
              std::
              variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                          *)0x283ee1);
              std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)0x283ef6);
              std::
              _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            *)0x283f03);
              pVar9 = std::
                      set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                               in_stack_fffffffffffffac8);
              in_stack_fffffffffffffb40 = pVar9.first._M_node;
              local_1b8 = pVar9.second;
              local_1c0 = in_stack_fffffffffffffb40._M_node;
              ppVar3 = std::
                       _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)0x283f4f);
              std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
              std::
              pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
              ::
              pair<int_&,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_&,_true>
                        (in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->id,
                         (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)0x283f7b);
              pVar8 = std::
                      map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                      ::insert(in_stack_fffffffffffffac0,
                               (value_type *)in_stack_fffffffffffffab8._M_current);
              in_stack_fffffffffffffb28 = pVar8.first._M_node;
              local_200 = pVar8.second;
              in_stack_fffffffffffffb24 = CONCAT13(local_200,(int3)in_stack_fffffffffffffb24);
              local_208 = in_stack_fffffffffffffb28._M_node;
              std::
              pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
              ::~pair((pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                       *)0x283fc8);
              ppVar3 = std::
                       _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)0x283fd5);
              std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
              std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                        ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->id);
              std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)0x284008);
              std::shared_ptr<mir::inst::PhiInst>::~shared_ptr
                        ((shared_ptr<mir::inst::PhiInst> *)0x284015);
            }
            else {
              std::_Rb_tree_const_iterator<mir::inst::VarId>::_Rb_tree_const_iterator(&local_210);
              std::
              _Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                            *)0x2840ad);
              std::
              _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            *)0x2840c3);
              local_218 = (_Base_ptr)
                          std::
                          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          ::find((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                  *)in_stack_fffffffffffffab8._M_current,
                                 (key_type *)in_stack_fffffffffffffab0);
              local_210._M_node = local_218;
              std::
              _Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                            *)0x284101);
              local_220._M_node =
                   (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffaa8);
              bVar1 = std::operator==(&local_210,&local_220);
              if (bVar1) {
                ppVar3 = std::
                         _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                       *)0x284140);
                std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
                local_228 = (_Base_ptr)
                            std::
                            map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                            ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                                    *)in_stack_fffffffffffffaa8,(key_type *)0x284164);
                std::
                _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                              *)0x284185);
                in_stack_fffffffffffffb00 = &local_248;
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffffab0,(VarId *)in_stack_fffffffffffffaa8);
                ir_phi((VarId *)in_stack_fffffffffffffb28._M_node,in_stack_fffffffffffffb24);
                ppVar5 = std::
                         _Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                         operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                                     *)0x2841c2);
                __k = &ppVar5->second->inst;
                std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                            *)0x2841d9);
                local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)
                     std::
                     vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                              *)in_stack_fffffffffffffaa8);
                local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)
                     __gnu_cxx::
                     __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                     ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                  *)in_stack_fffffffffffffab8._M_current,
                                 (difference_type)in_stack_fffffffffffffab0);
                __gnu_cxx::
                __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
                ::
                __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                          ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                            *)in_stack_fffffffffffffaa8);
                this_01 = &local_278;
                std::
                variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                ::
                variant<std::shared_ptr<mir::inst::PhiInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
                          ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                            *)in_stack_fffffffffffffab0,
                           (shared_ptr<mir::inst::PhiInst> *)in_stack_fffffffffffffaa8);
                in_stack_fffffffffffffaf8 =
                     std::
                     vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     ::insert((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                               *)in_stack_fffffffffffffab0,in_stack_fffffffffffffab8,
                              (value_type *)in_stack_fffffffffffffaa8);
                local_280 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                             *)in_stack_fffffffffffffaf8;
                std::
                variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                            *)0x28426f);
                std::
                _Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                              *)0x28427c);
                std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)in_stack_fffffffffffffab0,
                      (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)in_stack_fffffffffffffaa8);
                std::
                _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                              *)0x28429f);
                pVar9 = std::
                        set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                  *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                                 in_stack_fffffffffffffac8);
                local_2c0 = (_Base_ptr)pVar9.first._M_node;
                in_stack_fffffffffffffad7 = pVar9.second;
                local_2b8 = in_stack_fffffffffffffad7;
                ppVar3 = std::
                         _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                       *)0x2842df);
                std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
                in_stack_fffffffffffffac8 =
                     (value_type *)
                     std::
                     map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                     ::operator[](this_01,(key_type *)__k);
                std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)in_stack_fffffffffffffab0,
                            (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)in_stack_fffffffffffffaa8);
                ppVar3 = std::
                         _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                       *)0x28432b);
                std::vector<int,_std::allocator<int>_>::operator[](&ppVar3->second,(long)local_10c);
                std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                          ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->id);
                std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)0x28435e);
                std::shared_ptr<mir::inst::PhiInst>::~shared_ptr
                          ((shared_ptr<mir::inst::PhiInst> *)0x28436b);
              }
            }
          }
          local_10c = local_10c + 1;
        }
      }
    }
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x284406);
    local_2c8 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                              *)in_stack_fffffffffffffab8._M_current,
                             (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_fffffffffffffb00,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffffaf8._M_current);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_fffffffffffffb00,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffffaf8._M_current);
  vectors_difference(in_stack_fffffffffffffb48,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     in_stack_fffffffffffffb40._M_node);
  this_00 = &local_2e0;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
            (this_00,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     in_stack_fffffffffffffab8._M_current);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector(this_00);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_fffffffffffffab0,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_fffffffffffffaa8);
  build_dom_tree(in_stack_fffffffffffffc08);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x2844f9)
  ;
  local_374 = 0;
  while( true ) {
    uVar6 = (ulong)local_374;
    sVar7 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size(in_RCX);
    if (sVar7 <= uVar6) break;
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::clear
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x28453b);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
              (in_RCX,(long)local_374);
    this = &local_398;
    mir::inst::VarId::VarId(this,(VarId *)in_stack_fffffffffffffaa8);
    rename(local_388,(char *)this);
    push((VarId *)0x284586);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
              (in_RCX,(long)local_374);
    mir::inst::VarId::VarId(this,(VarId *)in_stack_fffffffffffffaa8);
    std::
    map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
           *)this,(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                   *)in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffaa8 =
         find_entry((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                     *)this);
    std::
    map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
           *)this,(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                   *)in_stack_fffffffffffffaa8);
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)this,(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_fffffffffffffaa8);
    rename_var(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)0x284635);
    std::
    map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::~map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            *)0x284642);
    std::
    map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
    ::~map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            *)0x28464f);
    local_374 = local_374 + 1;
  }
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x284763);
  std::
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x284770);
  return;
}

Assistant:

void generate_SSA(map<int, BasicBlock*> nodes,
                  map<mir::inst::VarId, set<int>> global,
                  map<int, vector<int>> dom_f, vector<mir::inst::VarId> vars,
                  map<int, int> dom) {
  map<mir::inst::VarId, set<int>>::iterator it;
  map<int, set<mir::inst::VarId>> phi;
  for (it = global.begin(); it != global.end(); it++) {
    queue<int> q;
    set<int>::iterator s;
    for (s = it->second.begin(); s != it->second.end(); s++) {
      q.push(*s);
    }
    while (!q.empty()) {
      int b = q.front();
      q.pop();
      map<int, vector<int>>::iterator itt = dom_f.find(b);
      if (itt != dom_f.end()) {
        for (int i = 0; i < itt->second.size(); i++) {
          map<int, set<mir::inst::VarId>>::iterator iter =
              phi.find(itt->second[i]);
          if (itt->second[i] >= 0) {
            if (iter == phi.end()) {
              map<int, BasicBlock*>::iterator itera =
                  nodes.find(itt->second[i]);
              shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
              //(*irphi).display(cout);
              itera->second->inst.insert(itera->second->inst.begin() + 1,
                                         irphi);
              set<mir::inst::VarId> varset;
              varset.insert(it->first);
              phi.insert(map<int, set<mir::inst::VarId>>::value_type(
                  itt->second[i], varset));
              q.push(itt->second[i]);
            } else {
              set<mir::inst::VarId>::iterator ss;
              ss = iter->second.find(it->first);
              if (ss == iter->second.end()) {
                map<int, BasicBlock*>::iterator itera =
                    nodes.find(itt->second[i]);
                shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
                //(*irphi).display(cout);
                itera->second->inst.insert(itera->second->inst.begin() + 1,
                                           irphi);
                set<mir::inst::VarId> varset = iter->second;
                varset.insert(it->first);
                phi[itt->second[i]] = varset;
                q.push(itt->second[i]);
              }
            }
          }
        }
      }
    }
  }

  // step3: number the vars, don't rename the $0(return value)
  vars = vectors_difference(vars, notRename);
  map<int, vector<int>> dom_tree = build_dom_tree(dom);
  for (int i = 0; i < vars.size(); i++) {
    V.clear();
    push(rename(vars[i]));
    rename_var(vars[i], find_entry(nodes), nodes, dom_tree);
  }
}